

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::umul_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined1 *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  APInt AVar3;
  APInt AStack_48;
  APInt local_38;
  
  operator*(this,RHS);
  bVar1 = operator!=(RHS,0);
  uVar2 = extraout_RDX;
  if (bVar1) {
    bVar1 = operator!=((APInt *)Overflow,0);
    uVar2 = extraout_RDX_00;
    if (bVar1) {
      udiv(&AStack_48,this);
      bVar1 = operator!=(&AStack_48,RHS);
      if (bVar1) {
        *in_RCX = 1;
      }
      else {
        udiv(&local_38,this);
        bVar1 = operator!=(&local_38,(APInt *)Overflow);
        *in_RCX = bVar1;
        ~APInt(&local_38);
      }
      ~APInt(&AStack_48);
      uVar2 = extraout_RDX_01;
      goto LAB_0016b583;
    }
  }
  *in_RCX = 0;
LAB_0016b583:
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::umul_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this * RHS;

  if (*this != 0 && RHS != 0)
    Overflow = Res.udiv(RHS) != *this || Res.udiv(*this) != RHS;
  else
    Overflow = false;
  return Res;
}